

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O3

QList<QGraphicsItem_*> * __thiscall
QGraphicsScene::selectedItems(QList<QGraphicsItem_*> *__return_storage_ptr__,QGraphicsScene *this)

{
  QSet<QGraphicsItem_*> *this_00;
  QGraphicsItem *this_01;
  ulong uVar1;
  bool bVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  long in_FS_OFFSET;
  QSet<QGraphicsItem_*> actuallySelectedSet;
  QHash<QGraphicsItem_*,_QHashDummyValue> local_50;
  QHashDummyValue local_41;
  QGraphicsItem *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar3 = *(long *)(this + 8);
  local_50.d = (Data *)0x0;
  this_00 = (QSet<QGraphicsItem_*> *)(lVar3 + 0x128);
  lVar4 = *(long *)(lVar3 + 0x128);
  if (lVar4 == 0) {
    lVar4 = 0;
    uVar5 = 0;
LAB_00604396:
    if ((uVar5 == 0) && (lVar4 == 0)) goto LAB_00604466;
  }
  else {
    if (**(char **)(lVar4 + 0x20) == -1) {
      uVar1 = 1;
      do {
        uVar5 = uVar1;
        if (*(ulong *)(lVar4 + 0x10) == uVar5) {
          lVar4 = 0;
          uVar5 = 0;
          break;
        }
        uVar1 = uVar5 + 1;
      } while ((*(char **)(lVar4 + 0x20))[(ulong)((uint)uVar5 & 0x7f) + (uVar5 >> 7) * 0x90] == -1);
      goto LAB_00604396;
    }
    uVar5 = 0;
  }
  do {
    lVar3 = (uVar5 >> 7) * 0x90;
    this_01 = *(QGraphicsItem **)
               (*(long *)(*(long *)(lVar4 + 0x20) + 0x80 + lVar3) +
               (ulong)*(byte *)((ulong)((uint)uVar5 & 0x7f) + *(long *)(lVar4 + 0x20) + lVar3) * 8);
    bVar2 = QGraphicsItem::isSelected(this_01);
    if (bVar2) {
      local_40 = this_01;
      QHash<QGraphicsItem*,QHashDummyValue>::emplace<QHashDummyValue_const&>
                ((QHash<QGraphicsItem*,QHashDummyValue> *)&local_50,&local_40,&local_41);
    }
    do {
      if (*(long *)(lVar4 + 0x10) - 1U == uVar5) {
        uVar5 = 0;
        lVar4 = 0;
        break;
      }
      uVar5 = uVar5 + 1;
    } while (*(char *)((ulong)((uint)uVar5 & 0x7f) + (uVar5 >> 7) * 0x90 + *(long *)(lVar4 + 0x20))
             == -1);
  } while ((uVar5 != 0) || (lVar4 != 0));
  lVar3 = *(long *)(this + 8);
LAB_00604466:
  QHash<QGraphicsItem_*,_QHashDummyValue>::operator=
            ((QHash<QGraphicsItem_*,_QHashDummyValue> *)(lVar3 + 0x128),&local_50);
  QSet<QGraphicsItem_*>::values(__return_storage_ptr__,this_00);
  QHash<QGraphicsItem_*,_QHashDummyValue>::~QHash(&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QList<QGraphicsItem *> QGraphicsScene::selectedItems() const
{
    Q_D(const QGraphicsScene);

    // Optimization: Lazily removes items that are not selected.
    QGraphicsScene *that = const_cast<QGraphicsScene *>(this);
    QSet<QGraphicsItem *> actuallySelectedSet;
    for (QGraphicsItem *item : std::as_const(that->d_func()->selectedItems)) {
        if (item->isSelected())
            actuallySelectedSet << item;
    }

    that->d_func()->selectedItems = actuallySelectedSet;

    return d->selectedItems.values();
}